

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

bool dxil_spv::emit_get_sample_position(Impl *impl,CallInst *instruction,bool image)

{
  Builder *this;
  CallInst *pCVar1;
  Id IVar2;
  Value *pVVar3;
  Operation *pOVar4;
  uint index;
  Operation *load_op;
  initializer_list<unsigned_int> local_120;
  Operation *local_110;
  Operation *chain_op;
  Id vec2_type;
  Id local_fc;
  initializer_list<unsigned_int> local_f8;
  Operation *local_e8;
  Operation *final_lut_index_op;
  initializer_list<unsigned_int> local_d8;
  Operation *local_c8;
  Operation *cmp_op;
  initializer_list<unsigned_int> local_b8;
  Operation *local_a8;
  Operation *cmp1_op;
  initializer_list<unsigned_int> local_98;
  Operation *local_88;
  Operation *cmp0_op;
  initializer_list<unsigned_int> local_78;
  Operation *local_68;
  Operation *lut_offset_op;
  initializer_list<unsigned_int> local_58;
  Operation *local_48;
  Operation *lut_base_offset_op;
  Operation *pOStack_38;
  Id sample_index_id;
  Operation *query_samples_op;
  Id image_id;
  Id sample_count_id;
  Builder *builder;
  CallInst *pCStack_18;
  bool image_local;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder._7_1_ = image;
  pCStack_18 = instruction;
  instruction_local = (CallInst *)impl;
  _image_id = Converter::Impl::builder(impl);
  pCVar1 = instruction_local;
  if ((builder._7_1_ & 1) == 0) {
    query_samples_op._4_4_ = build_rasterizer_sample_count((Impl *)instruction_local);
  }
  else {
    pVVar3 = LLVMBC::Instruction::getOperand(&pCStack_18->super_Instruction,1);
    query_samples_op._0_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar3,0);
    pCVar1 = instruction_local;
    IVar2 = spv::Builder::makeUintType(_image_id,0x20);
    pOStack_38 = Converter::Impl::allocate((Impl *)pCVar1,OpImageQuerySamples,IVar2);
    Operation::add_id(pOStack_38,(Id)query_samples_op);
    Converter::Impl::add((Impl *)instruction_local,pOStack_38,false);
    query_samples_op._4_4_ = pOStack_38->id;
  }
  pCVar1 = instruction_local;
  index = 1;
  if ((builder._7_1_ & 1) != 0) {
    index = 2;
  }
  pVVar3 = LLVMBC::Instruction::getOperand(&pCStack_18->super_Instruction,index);
  lut_base_offset_op._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar3,0);
  build_sample_position_lut((Impl *)instruction_local);
  pCVar1 = instruction_local;
  IVar2 = spv::Builder::makeUintType(_image_id,0x20);
  pOVar4 = Converter::Impl::allocate((Impl *)pCVar1,OpISub,IVar2);
  lut_offset_op._0_4_ = query_samples_op._4_4_;
  local_48 = pOVar4;
  lut_offset_op._4_4_ = spv::Builder::makeUintConstant(_image_id,1,false);
  local_58._M_array = (iterator)&lut_offset_op;
  local_58._M_len = 2;
  Operation::add_ids(pOVar4,&local_58);
  Converter::Impl::add((Impl *)instruction_local,local_48,false);
  pCVar1 = instruction_local;
  IVar2 = spv::Builder::makeUintType(_image_id,0x20);
  local_68 = Converter::Impl::allocate((Impl *)pCVar1,OpIAdd,IVar2);
  cmp0_op._0_4_ = local_48->id;
  cmp0_op._4_4_ = lut_base_offset_op._4_4_;
  local_78._M_array = (iterator)&cmp0_op;
  local_78._M_len = 2;
  Operation::add_ids(local_68,&local_78);
  Converter::Impl::add((Impl *)instruction_local,local_68,false);
  pCVar1 = instruction_local;
  IVar2 = spv::Builder::makeBoolType(_image_id);
  local_88 = Converter::Impl::allocate((Impl *)pCVar1,OpULessThan,IVar2);
  cmp1_op._0_4_ = lut_base_offset_op._4_4_;
  cmp1_op._4_4_ = query_samples_op._4_4_;
  local_98._M_array = (iterator)&cmp1_op;
  local_98._M_len = 2;
  Operation::add_ids(local_88,&local_98);
  Converter::Impl::add((Impl *)instruction_local,local_88,false);
  pCVar1 = instruction_local;
  IVar2 = spv::Builder::makeBoolType(_image_id);
  pOVar4 = Converter::Impl::allocate((Impl *)pCVar1,OpULessThanEqual,IVar2);
  cmp_op._0_4_ = query_samples_op._4_4_;
  local_a8 = pOVar4;
  cmp_op._4_4_ = spv::Builder::makeUintConstant(_image_id,0x10,false);
  local_b8._M_array = (iterator)&cmp_op;
  local_b8._M_len = 2;
  Operation::add_ids(pOVar4,&local_b8);
  Converter::Impl::add((Impl *)instruction_local,local_a8,false);
  pCVar1 = instruction_local;
  IVar2 = spv::Builder::makeBoolType(_image_id);
  local_c8 = Converter::Impl::allocate((Impl *)pCVar1,OpLogicalAnd,IVar2);
  final_lut_index_op._0_4_ = local_88->id;
  final_lut_index_op._4_4_ = local_a8->id;
  local_d8._M_array = (iterator)&final_lut_index_op;
  local_d8._M_len = 2;
  Operation::add_ids(local_c8,&local_d8);
  Converter::Impl::add((Impl *)instruction_local,local_c8,false);
  pCVar1 = instruction_local;
  IVar2 = spv::Builder::makeUintType(_image_id,0x20);
  pOVar4 = Converter::Impl::allocate((Impl *)pCVar1,OpSelect,IVar2);
  chain_op._4_4_ = local_c8->id;
  vec2_type = local_68->id;
  local_e8 = pOVar4;
  local_fc = spv::Builder::makeUintConstant(_image_id,0,false);
  local_f8._M_array = (iterator)((long)&chain_op + 4);
  local_f8._M_len = 3;
  Operation::add_ids(pOVar4,&local_f8);
  Converter::Impl::add((Impl *)instruction_local,local_e8,false);
  this = _image_id;
  IVar2 = spv::Builder::makeFloatType(_image_id,0x20);
  chain_op._0_4_ = spv::Builder::makeVectorType(this,IVar2,2);
  pCVar1 = instruction_local;
  IVar2 = spv::Builder::makePointer(_image_id,StorageClassPrivate,(Id)chain_op);
  local_110 = Converter::Impl::allocate((Impl *)pCVar1,OpAccessChain,IVar2);
  load_op._0_4_ =
       instruction_local[0x16].super_Instruction.attachments._M_h._M_rehash_policy.
       _M_max_load_factor;
  load_op._4_4_ = local_e8->id;
  local_120._M_array = (iterator)&load_op;
  local_120._M_len = 2;
  Operation::add_ids(local_110,&local_120);
  Converter::Impl::add((Impl *)instruction_local,local_110,false);
  pOVar4 = Converter::Impl::allocate
                     ((Impl *)instruction_local,OpLoad,(Value *)pCStack_18,(Id)chain_op);
  Operation::add_id(pOVar4,local_110->id);
  Converter::Impl::add((Impl *)instruction_local,pOVar4,false);
  spv::Builder::addCapability(_image_id,CapabilityImageQuery);
  return true;
}

Assistant:

bool emit_get_sample_position(Converter::Impl &impl, const llvm::CallInst *instruction, bool image)
{
	auto &builder = impl.builder();

	spv::Id sample_count_id;
	if (image)
	{
		spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));

		auto *query_samples_op = impl.allocate(spv::OpImageQuerySamples, builder.makeUintType(32));
		query_samples_op->add_id(image_id);
		impl.add(query_samples_op);
		sample_count_id = query_samples_op->id;
	}
	else
	{
		sample_count_id = build_rasterizer_sample_count(impl);
	}

	spv::Id sample_index_id = impl.get_id_for_value(instruction->getOperand(image ? 2 : 1));

	// Build the LUT if we have to.
	build_sample_position_lut(impl);

	// Sample count is only POT, so table starts at N - 1.
	auto *lut_base_offset_op = impl.allocate(spv::OpISub, builder.makeUintType(32));
	lut_base_offset_op->add_ids({ sample_count_id, builder.makeUintConstant(1) });
	impl.add(lut_base_offset_op);

	// Build LUT offset.
	auto *lut_offset_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
	lut_offset_op->add_ids({ lut_base_offset_op->id, sample_index_id });
	impl.add(lut_offset_op);

	// Range check sample index against actual texture.
	auto *cmp0_op = impl.allocate(spv::OpULessThan, builder.makeBoolType());
	cmp0_op->add_ids({ sample_index_id, sample_count_id });
	impl.add(cmp0_op);

	// Range check sample index against max supported 16.
	auto *cmp1_op = impl.allocate(spv::OpULessThanEqual, builder.makeBoolType());
	cmp1_op->add_ids({ sample_count_id, builder.makeUintConstant(16) });
	impl.add(cmp1_op);

	auto *cmp_op = impl.allocate(spv::OpLogicalAnd, builder.makeBoolType());
	cmp_op->add_ids({ cmp0_op->id, cmp1_op->id });
	impl.add(cmp_op);

	auto *final_lut_index_op = impl.allocate(spv::OpSelect, builder.makeUintType(32));
	final_lut_index_op->add_ids({ cmp_op->id, lut_offset_op->id, builder.makeUintConstant(0) });
	impl.add(final_lut_index_op);

	spv::Id vec2_type = builder.makeVectorType(builder.makeFloatType(32), 2);

	auto *chain_op = impl.allocate(spv::OpAccessChain, builder.makePointer(spv::StorageClassPrivate, vec2_type));
	chain_op->add_ids({ impl.texture_sample_pos_lut_id, final_lut_index_op->id });
	impl.add(chain_op);

	auto *load_op = impl.allocate(spv::OpLoad, instruction, vec2_type);
	load_op->add_id(chain_op->id);
	impl.add(load_op);

	builder.addCapability(spv::CapabilityImageQuery);
	return true;
}